

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestEnd
          (BriefUnitTestResultPrinter *this,TestInfo *test_info)

{
  bool bVar1;
  TestInfo *test_info_00;
  TestResult *this_00;
  undefined8 uVar2;
  TestInfo *in_RSI;
  char *in_stack_ffffffffffffffa8;
  TestResult *in_stack_ffffffffffffffb8;
  string local_30 [8];
  long *in_stack_ffffffffffffffd8;
  
  TestInfo::result(in_RSI);
  bVar1 = TestResult::Failed(in_stack_ffffffffffffffb8);
  if (bVar1) {
    ColoredPrintf(kRed,"[  FAILED  ] ");
    test_info_00 = (TestInfo *)TestInfo::test_suite_name((TestInfo *)0x14b656);
    TestInfo::name((TestInfo *)0x14b665);
    PrintTestName((char *)test_info_00,in_stack_ffffffffffffffa8);
    PrintFullTestCommentIfPresent(test_info_00);
    if ((FLAGS_gtest_print_time & 1) == 0) {
      printf("\n");
    }
    else {
      this_00 = TestInfo::result(in_RSI);
      TestResult::elapsed_time(this_00);
      StreamableToString<long>(in_stack_ffffffffffffffd8);
      uVar2 = std::__cxx11::string::c_str();
      printf(" (%s ms)\n",uVar2);
      std::__cxx11::string::~string(local_30);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Failed()) {
    ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
    PrintTestName(test_info.test_suite_name(), test_info.name());
    PrintFullTestCommentIfPresent(test_info);

    if (GTEST_FLAG_GET(print_time)) {
      printf(" (%s ms)\n",
             internal::StreamableToString(test_info.result()->elapsed_time())
                 .c_str());
    } else {
      printf("\n");
    }
    fflush(stdout);
  }
}